

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

string * __thiscall Catch::RunContext::getCurrentTestName_abi_cxx11_(RunContext *this)

{
  TestCaseInfo *pTVar1;
  long in_RSI;
  string *in_RDI;
  
  if (*(long *)(in_RSI + 0x38) == 0) {
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    pTVar1 = TestCase::getTestCaseInfo(*(TestCase **)(in_RSI + 0x38));
    std::__cxx11::string::string((string *)in_RDI,(string *)pTVar1);
  }
  return in_RDI;
}

Assistant:

std::string RunContext::getCurrentTestName() const {
        return m_activeTestCase
            ? m_activeTestCase->getTestCaseInfo().name
            : std::string();
    }